

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O3

void __thiscall
icu_63::SimpleDateFormat::parseInt
          (SimpleDateFormat *this,UnicodeString *text,Formattable *number,int32_t maxDigits,
          ParsePosition *pos,UBool allowNegative,NumberFormat *fmt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  long lVar6;
  NumberFormat *pNVar7;
  int l;
  UnicodeString oldPrefix;
  ConstChar16Ptr local_c8;
  char16_t *local_c0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  pNVar7 = (NumberFormat *)0x0;
  plVar5 = (long *)__dynamic_cast(fmt,&NumberFormat::typeinfo,&DecimalFormat::typeinfo,0);
  if (plVar5 != (long *)0x0 && allowNegative == '\0') {
    lVar6 = (**(code **)(*plVar5 + 0x20))(plVar5);
    if (lVar6 == 0) goto LAB_002c796f;
    pNVar7 = (NumberFormat *)__dynamic_cast(lVar6,&Format::typeinfo,&DecimalFormat::typeinfo,0);
    if (pNVar7 == (NumberFormat *)0x0) goto LAB_002c796f;
    local_c8.p_ = L"꬀";
    icu_63::UnicodeString::UnicodeString(&local_b0,'\x01',&local_c8,-1);
    (*(pNVar7->super_Format).super_UObject._vptr_UObject[0x2e])(pNVar7,&local_b0);
    icu_63::UnicodeString::~UnicodeString(&local_b0);
    local_c0 = local_c8.p_;
    fmt = pNVar7;
  }
  iVar1 = pos->index;
  (*(fmt->super_Format).super_UObject._vptr_UObject[0x14])(fmt,text,number,pos);
  if (0 < maxDigits) {
    iVar2 = pos->index - iVar1;
    iVar3 = iVar2 - maxDigits;
    if (iVar3 != 0 && maxDigits <= iVar2) {
      l = *(int *)&number->fValue;
      if (iVar3 != 0 && maxDigits <= iVar2) {
        uVar4 = iVar3 + 1;
        do {
          l = l / 10;
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      pos->index = iVar1 + maxDigits;
      Formattable::setLong(number,l);
    }
  }
  if (pNVar7 != (NumberFormat *)0x0) {
    (*(pNVar7->super_Format).super_UObject._vptr_UObject[1])(pNVar7);
  }
LAB_002c796f:
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void SimpleDateFormat::parseInt(const UnicodeString& text,
                                Formattable& number,
                                int32_t maxDigits,
                                ParsePosition& pos,
                                UBool allowNegative,
                                const NumberFormat *fmt) const {
    UnicodeString oldPrefix;
    auto* fmtAsDF = dynamic_cast<const DecimalFormat*>(fmt);
    LocalPointer<DecimalFormat> df;
    if (!allowNegative && fmtAsDF != nullptr) {
        df.adoptInstead(dynamic_cast<DecimalFormat*>(fmtAsDF->clone()));
        if (df.isNull()) {
            // Memory allocation error
            return;
        }
        df->setNegativePrefix(UnicodeString(TRUE, SUPPRESS_NEGATIVE_PREFIX, -1));
        fmt = df.getAlias();
    }
    int32_t oldPos = pos.getIndex();
    fmt->parse(text, number, pos);

    if (maxDigits > 0) {
        // adjust the result to fit into
        // the maxDigits and move the position back
        int32_t nDigits = pos.getIndex() - oldPos;
        if (nDigits > maxDigits) {
            int32_t val = number.getLong();
            nDigits -= maxDigits;
            while (nDigits > 0) {
                val /= 10;
                nDigits--;
            }
            pos.setIndex(oldPos + maxDigits);
            number.setLong(val);
        }
    }
}